

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *input_file_00;
  char *output_dir_00;
  int iVar1;
  int iVar2;
  time_t tVar3;
  char *output_dir;
  char *input_file;
  char default_flags [25];
  char **local_30;
  char *flags;
  char *sprite;
  uint64_t seed;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  input_file = (char *)0x4143564141495649;
  builtin_strncpy(default_flags,"KACAAAAAAAAAAEAA",0x11);
  seed = (uint64_t)argv;
  argv_local._0_4_ = argc;
  printf("DWRandomizer version %s\n","3.0.3 beta 698");
  if ((int)argv_local < 3) {
    print_usage(*(char **)seed,(char *)&input_file);
    exit(0);
  }
  input_file_00 = *(char **)(seed + 8);
  output_dir_00 = *(char **)(seed + (long)((int)argv_local + -1) * 8);
  if ((int)argv_local < 4) {
    local_30 = &input_file;
  }
  else {
    local_30 = *(char ***)(seed + 0x10);
  }
  if (4 < (int)argv_local) {
    iVar1 = __isoc99_sscanf(*(undefined8 *)(seed + 0x18),"%lu",&sprite);
    if (iVar1 == 1) goto LAB_001023f5;
  }
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  iVar1 = rand();
  iVar2 = rand();
  sprite = (char *)CONCAT44(iVar1,iVar2);
LAB_001023f5:
  if ((int)argv_local < 6) {
    flags = "Random";
  }
  else {
    flags = *(char **)(seed + 0x20);
  }
  printf("Randomizing using seed: %lu with flags %s\n",sprite,local_30);
  dwr_randomize(input_file_00,(uint64_t)sprite,(char *)local_30,flags,output_dir_00);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    uint64_t seed;
    const char *sprite;
    char *flags;
    char default_flags[] = DEFAULT_FLAGS;
    char *input_file, *output_dir;

    printf("DWRandomizer version %s\n", VERSION);
    if (argc < 3) {
        print_usage(argv[0], default_flags);
        exit(0);
    }

    input_file = argv[1];
    output_dir = argv[argc-1];
    if (argc >= 4) {
        flags = argv[2];
    } else {
        flags = default_flags;
    }
    if (argc < 5 || sscanf(argv[3], "%"PRIu64, &seed) != 1) {
        srand(time(NULL));
        seed = ((uint64_t)rand() << 32) | ((uint64_t)rand() & 0xffffffffL);
    }
    if (argc > 5) {
        sprite = argv[4];
    } else {
        sprite = "Random";
    }

    printf("Randomizing using seed: %"PRIu64" with flags %s\n", seed, flags);

    dwr_randomize(input_file, seed, flags, sprite, output_dir);

    return 0;
}